

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

bool __thiscall dg::llvmdg::legacy::Block::removePredecessor(Block *this,Block *predecessor)

{
  size_type sVar1;
  long in_RSI;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_RDI;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::
    set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::erase(in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::
            set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ::erase(in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool Block::removePredecessor(Block *predecessor) {
    if (!predecessor) {
        return false;
    }
    predecessors_.erase(predecessor);
    return predecessor->successors_.erase(this);
}